

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Orphan<capnp::DynamicStruct> * __thiscall
capnp::Orphanage::newOrphan
          (Orphan<capnp::DynamicStruct> *__return_storage_ptr__,Orphanage *this,StructSchema schema)

{
  BuilderArena *arena;
  CapTableBuilder *capTable;
  uint uVar1;
  ushort uVar2;
  Schema local_60;
  Reader local_58;
  
  arena = this->arena;
  capTable = this->capTable;
  local_60 = schema.super_Schema.raw;
  Schema::getProto(&local_58,&local_60);
  uVar1 = 0;
  if (local_58._reader.dataSize < 0x80) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(ushort *)
             ((long)&(((CapTableBuilder *)((long)local_58._reader.data + 8))->super_CapTableReader).
                     _vptr_CapTableReader + 6);
    if (0xcf < local_58._reader.dataSize) {
      uVar1 = (uint)*(ushort *)
                     &(((CapTableBuilder *)((long)local_58._reader.data + 0x18))->
                      super_CapTableReader)._vptr_CapTableReader << 0x10;
    }
  }
  capnp::_::OrphanBuilder::initStruct
            ((OrphanBuilder *)&local_58,arena,capTable,(StructSize)(uVar2 | uVar1));
  (__return_storage_ptr__->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)local_58._reader.capTable;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)local_58._reader.data;
  (__return_storage_ptr__->builder).location = (word *)local_58._reader.pointers;
  (__return_storage_ptr__->builder).tag.content = (uint64_t)local_58._reader.segment;
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicStruct> Orphanage::newOrphan(StructSchema schema) const {
  return Orphan<DynamicStruct>(
      schema, _::OrphanBuilder::initStruct(arena, capTable, structSizeFromSchema(schema)));
}